

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O2

void __thiscall
lwlog::
logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
::logger<>(logger<lwlog::configuration<lwlog::disable_local_time,_lwlog::enable_thread_id,_lwlog::enable_process_id,_lwlog::enable_topics>,_lwlog::synchronous_policy,_lwlog::immediate_flush_policy,_lwlog::single_threaded_policy,_lwlog::sinks::stdout_sink>
           *this,string_view name)

{
  string_view flag;
  string_view flag_00;
  _Variant_storage_alias<std::reference_wrapper<int>,_std::reference_wrapper<float>,_std::reference_wrapper<double>,_std::reference_wrapper<std::__cxx11::basic_string<char>_>,_std::reference_wrapper<std::basic_string_view<char>_>,_std::reference_wrapper<lwlog::level>_>
  in_stack_ffffffffffffffd8;
  
  (this->super_logger)._vptr_logger = (_func_int **)&PTR__logger_0011f1f8;
  (this->m_name)._M_len = name._M_len;
  (this->m_name)._M_str = name._M_str;
  (this->m_backend).sink_storage.
  super__Vector_base<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_backend).sink_storage.
  super__Vector_base<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_backend).sink_storage.
  super__Vector_base<std::shared_ptr<lwlog::interface::sink>,_std::allocator<std::shared_ptr<lwlog::interface::sink>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_topics).super_topic_registry_base._vptr_topic_registry_base =
       (_func_int **)&PTR__topic_registry_0011f1b0;
  (this->m_topics).m_current_topic._M_len = 0;
  (this->m_topics).m_current_topic._M_str = (char *)0x0;
  (this->m_topics).m_separator._M_len = 0;
  (this->m_topics).m_separator._M_str = (char *)0x0;
  (this->m_topics).m_topics.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_topics).m_topics.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_topics).m_topics.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  registry::instance();
  if (registry::instance::s_instance.m_is_registry_automatic == true) {
    registry::instance();
    registry::register_logger(&registry::instance::s_instance,&this->super_logger);
  }
  sinks::
  sink_factory<lwlog::sinks::stdout_sink<lwlog::immediate_flush_policy,_lwlog::single_threaded_policy>_>
  ::request<>();
  std::
  vector<std::shared_ptr<lwlog::interface::sink>,std::allocator<std::shared_ptr<lwlog::interface::sink>>>
  ::_M_assign_aux<std::shared_ptr<lwlog::interface::sink>const*>
            ((vector<std::shared_ptr<lwlog::interface::sink>,std::allocator<std::shared_ptr<lwlog::interface::sink>>>
              *)&this->m_backend,&stack0xffffffffffffffd8,&stack0xffffffffffffffe8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  flag._M_str = "{name}";
  flag._M_len = 6;
  add_attribute(this,flag,(attrib_value)in_stack_ffffffffffffffd8);
  flag_00._M_str = "%n";
  flag_00._M_len = 2;
  add_attribute(this,flag_00,(attrib_value)in_stack_ffffffffffffffd8);
  (this->m_topics).m_separator._M_len = 1;
  (this->m_topics).m_separator._M_str = "/";
  return;
}

Assistant:

logger<Config, LogExecutionPolicy, FlushPolicy, ThreadingPolicy, Sinks...>::logger(std::string_view name,
		SinkParams&&... params)
		: m_name{ name }
	{
		LogExecutionPolicy::template init<Config>(m_backend);

		if(registry::instance().is_registry_automatic()) 
			registry::instance().register_logger(this);

		m_backend.sink_storage = { sinks::sink_factory<Sinks<FlushPolicy, ThreadingPolicy>>::request(
			std::forward<SinkParams>(params)...
		)... };

		logger::add_attribute("{name}", m_name);
		logger::add_attribute("%n", m_name);

		logger::set_topic_separator("/");
	}